

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaintype.cpp
# Opt level: O1

optional<ChainType> ChainTypeFromString(string_view chain)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  size_type __rlen;
  char *__s1;
  size_t __n;
  ulong uVar4;
  long in_FS_OFFSET;
  
  __s1 = chain._M_str;
  __n = chain._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 3;
  uVar3 = 0;
  switch(__n - 4) {
  case 0:
    iVar2 = bcmp(__s1,"main",__n);
    if (iVar2 != 0) {
      uVar3 = 0;
      switch(__n - 4) {
      case 0:
        iVar2 = bcmp(__s1,"test",__n);
        if (iVar2 == 0) {
          uVar4 = 1;
          goto LAB_0015377f;
        }
        if (__n == 6) goto switchD_001536a6_caseD_2;
        if (__n == 7) goto switchD_001536a6_caseD_3;
        if (__n == 8) goto switchD_001536a6_caseD_4;
        goto LAB_00153768;
      default:
        goto switchD_001536a6_caseD_1;
      case 2:
        goto switchD_001536a6_caseD_2;
      case 3:
        goto switchD_001536a6_caseD_3;
      case 4:
        goto switchD_001536a6_caseD_4;
      }
    }
    uVar4 = 0;
    goto LAB_0015377f;
  default:
    goto switchD_001536a6_caseD_1;
  case 2:
switchD_001536a6_caseD_2:
    iVar2 = bcmp(__s1,"signet",__n);
    if (iVar2 == 0) {
      uVar4 = 2;
LAB_0015377f:
      uVar3 = 0x100000000;
      goto switchD_001536a6_caseD_1;
    }
    if (__n != 7) {
LAB_00153768:
      uVar3 = 0;
      goto switchD_001536a6_caseD_1;
    }
    break;
  case 3:
    break;
  case 4:
switchD_001536a6_caseD_4:
    iVar2 = bcmp(__s1,"testnet4",__n);
    if (iVar2 == 0) {
      uVar4 = 4;
      goto LAB_0015377f;
    }
    if (__n != 7) {
      if (__n != 6) goto LAB_00153768;
      goto switchD_001536a6_caseD_2;
    }
  }
switchD_001536a6_caseD_3:
  iVar2 = bcmp(__s1,"regtest",__n);
  uVar3 = 0;
  if (iVar2 == 0) {
    uVar3 = 0x100000000;
  }
switchD_001536a6_caseD_1:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<ChainType>)(uVar3 | uVar4);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<ChainType> ChainTypeFromString(std::string_view chain)
{
    if (chain == "main") {
        return ChainType::MAIN;
    } else if (chain == "test") {
        return ChainType::TESTNET;
    } else if (chain == "testnet4") {
        return ChainType::TESTNET4;
    } else if (chain == "signet") {
        return ChainType::SIGNET;
    } else if (chain == "regtest") {
        return ChainType::REGTEST;
    } else {
        return std::nullopt;
    }
}